

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLParser.cpp
# Opt level: O0

string * stringFromFormattedCString_abi_cxx11_(char *message,__va_list_tag *arguments)

{
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> __end;
  char *__s;
  size_type __maxlen;
  undefined8 *in_RDX;
  char *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  vector<char,_std::allocator<char>_> buffer;
  int length;
  va_list tempArguments;
  vector<char,_std::allocator<char>_> *in_stack_ffffffffffffff38;
  allocator_type *in_stack_ffffffffffffff50;
  vector<char,_std::allocator<char>_> *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  __normal_iterator<char_*,_std::vector<char,_std::allocator<char>_>_> __beg;
  undefined1 local_81 [9];
  char *local_78;
  allocator<char> local_59;
  vector<char,_std::allocator<char>_> local_58;
  int local_3c;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  undefined8 *local_18;
  char *local_10;
  
  local_28 = in_RDX[2];
  local_38 = *in_RDX;
  uStack_30 = in_RDX[1];
  this_00 = in_RDI;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_3c = vsnprintf((char *)0x0,0,in_RSI,&local_38);
  __end._M_current = (char *)(long)(local_3c + 1);
  __beg._M_current = (char *)&local_59;
  std::allocator<char>::allocator();
  std::vector<char,_std::allocator<char>_>::vector
            ((vector<char,_std::allocator<char>_> *)this_00,(size_type)in_RDI,
             in_stack_ffffffffffffff50);
  std::allocator<char>::~allocator(&local_59);
  __s = std::vector<char,_std::allocator<char>_>::data
                  ((vector<char,_std::allocator<char>_> *)0x1289db);
  __maxlen = std::vector<char,_std::allocator<char>_>::size(&local_58);
  vsnprintf(__s,__maxlen,local_10,local_18);
  local_78 = (char *)std::vector<char,_std::allocator<char>_>::begin(in_stack_ffffffffffffff38);
  local_81._1_8_ = std::vector<char,_std::allocator<char>_>::end(in_stack_ffffffffffffff38);
  this = (vector<char,_std::allocator<char>_> *)local_81;
  std::allocator<char>::allocator();
  std::__cxx11::string::
  string<__gnu_cxx::__normal_iterator<char*,std::vector<char,std::allocator<char>>>,void>
            (this_00,__beg,__end,(allocator<char> *)in_RDI);
  std::allocator<char>::~allocator((allocator<char> *)local_81);
  std::vector<char,_std::allocator<char>_>::~vector(this);
  return this_00;
}

Assistant:

static const std::string stringFromFormattedCString(const char *message, va_list arguments)
{
    va_list tempArguments;
    va_copy(tempArguments, arguments);
    // We have to get the size of the final string.
    // We use vsnprintf with an empty buffer
    // (the function returns the number of characters that didn't fit the buffer)
    va_copy(tempArguments, arguments);
    int length = std::vsnprintf(NULL, 0, message, tempArguments);
    va_end(tempArguments);

    // We now have the size. We can create the real string.
    std::vector<char> buffer(length + 1);
    std::vsnprintf(buffer.data(), buffer.size(), message, arguments);

    return std::string(buffer.begin(), buffer.end());
}